

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

iterator __thiscall
google::protobuf::RepeatedField<bool>::erase(RepeatedField<bool> *this,const_iterator position)

{
  void *pvVar1;
  size_t __n;
  void *__dest;
  long lVar2;
  
  pvVar1 = this->arena_or_elements_;
  lVar2 = (long)((int)position - (int)pvVar1);
  __dest = (void *)((long)pvVar1 + lVar2);
  __n = (long)pvVar1 + ((long)this->current_size_ - (long)(position + 1));
  if (__n != 0) {
    memmove(__dest,position + 1,__n);
  }
  if (0 < this->current_size_) {
    this->current_size_ = ((int)__dest + (int)__n) - *(int *)&this->arena_or_elements_;
  }
  return (iterator)(lVar2 + (long)this->arena_or_elements_);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}